

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parserInternals.c
# Opt level: O0

int xmlParserGrow(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr input;
  xmlParserInputBufferPtr in_00;
  int iVar1;
  ulong pos;
  int ret;
  size_t maxLength;
  size_t curBase;
  size_t curEnd;
  xmlParserInputBufferPtr buf;
  xmlParserInputPtr in;
  xmlParserCtxtPtr ctxt_local;
  
  input = ctxt->input;
  in_00 = input->buf;
  pos = (long)input->cur - (long)input->base;
  iVar1 = 10000000;
  if ((ctxt->options & 0x80000U) != 0) {
    iVar1 = 1000000000;
  }
  if (in_00 == (xmlParserInputBufferPtr)0x0) {
    ctxt_local._4_4_ = 0;
  }
  else if ((ctxt->input->flags & 0x40U) == 0) {
    if ((in_00->encoder == (xmlCharEncodingHandlerPtr)0x0) &&
       (in_00->readcallback == (xmlInputReadCallback)0x0)) {
      ctxt_local._4_4_ = 0;
    }
    else if (in_00->error == 0) {
      if ((ulong)(long)iVar1 < pos) {
        xmlFatalErr(ctxt,XML_ERR_RESOURCE_LIMIT,"Buffer size limit exceeded, try XML_PARSE_HUGE\n");
        xmlHaltParser(ctxt);
        ctxt_local._4_4_ = -1;
      }
      else if ((ulong)((long)input->end - (long)input->cur) < 0xfa) {
        ctxt_local._4_4_ = xmlParserInputBufferGrow(in_00,0xfa);
        xmlBufUpdateInput(in_00->buffer,input,pos);
        if (ctxt_local._4_4_ < 0) {
          xmlCtxtErrIO(ctxt,in_00->error,(char *)0x0);
        }
      }
      else {
        ctxt_local._4_4_ = 0;
      }
    }
    else {
      ctxt_local._4_4_ = -1;
    }
  }
  else {
    ctxt_local._4_4_ = 0;
  }
  return ctxt_local._4_4_;
}

Assistant:

int
xmlParserGrow(xmlParserCtxtPtr ctxt) {
    xmlParserInputPtr in = ctxt->input;
    xmlParserInputBufferPtr buf = in->buf;
    size_t curEnd = in->end - in->cur;
    size_t curBase = in->cur - in->base;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_LOOKUP_LIMIT;
    int ret;

    if (buf == NULL)
        return(0);
    /* Don't grow push parser buffer. */
    if (PARSER_PROGRESSIVE(ctxt))
        return(0);
    /* Don't grow memory buffers. */
    if ((buf->encoder == NULL) && (buf->readcallback == NULL))
        return(0);
    if (buf->error != 0)
        return(-1);

    if (curBase > maxLength) {
        xmlFatalErr(ctxt, XML_ERR_RESOURCE_LIMIT,
                    "Buffer size limit exceeded, try XML_PARSE_HUGE\n");
        xmlHaltParser(ctxt);
	return(-1);
    }

    if (curEnd >= INPUT_CHUNK)
        return(0);

    ret = xmlParserInputBufferGrow(buf, INPUT_CHUNK);
    xmlBufUpdateInput(buf->buffer, in, curBase);

    if (ret < 0) {
        xmlCtxtErrIO(ctxt, buf->error, NULL);
    }

    return(ret);
}